

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QOpenGLSharedResource_*>::relocate
          (QArrayDataPointer<QOpenGLSharedResource_*> *this,qsizetype offset,
          QOpenGLSharedResource ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QOpenGLSharedResource_*> *in_RDI;
  QOpenGLSharedResource ***unaff_retaddr;
  QOpenGLSharedResource **res;
  QOpenGLSharedResource **first;
  QArrayDataPointer<QOpenGLSharedResource_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QOpenGLSharedResource*,long_long>
            (first,(longlong)in_RDI,(QOpenGLSharedResource **)0x8ff167);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QOpenGLSharedResource*>,QOpenGLSharedResource*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }